

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O2

Status * __thiscall
draco::Encoder::SetAttributePredictionScheme
          (Status *__return_storage_ptr__,Encoder *this,Type type,int prediction_scheme_method)

{
  allocator<char> local_3d;
  Type local_3c;
  string local_38;
  
  local_3c = type;
  EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::CheckPredictionScheme
            (__return_storage_ptr__,
             &this->super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>,
             type,prediction_scheme_method);
  if (__return_storage_ptr__->code_ == OK) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"prediction_scheme",&local_3d);
    DracoOptions<draco::GeometryAttribute::Type>::SetAttributeInt
              (&(this->super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>
                ).options_.super_DracoOptions<draco::GeometryAttribute::Type>,&local_3c,&local_38,
               prediction_scheme_method);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Status Encoder::SetAttributePredictionScheme(GeometryAttribute::Type type,
                                             int prediction_scheme_method) {
  Status status = CheckPredictionScheme(type, prediction_scheme_method);
  if (!status.ok()) {
    return status;
  }
  options().SetAttributeInt(type, "prediction_scheme",
                            prediction_scheme_method);
  return status;
}